

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>>::
findNode<std::pair<QObject*,QByteArray>>
          (Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_> *this,
          pair<QObject_*,_QByteArray> *key)

{
  long lVar1;
  bool bVar2;
  Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_> *in_RSI;
  long in_FS_OFFSET;
  Bucket bucket;
  pair<QObject_*,_QByteArray> *in_stack_ffffffffffffffc8;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<std::pair<QObject*,QByteArray>>(in_RSI,in_stack_ffffffffffffffc8);
  bVar2 = Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>::Bucket
          ::isUnused((Bucket *)0x6879fb);
  if (bVar2) {
    local_20 = (Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *)0x0;
  }
  else {
    local_20 = Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>::
               Bucket::node((Bucket *)0x687a16);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }